

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O1

int https_checkfile(char *urltype,char *infile,char *outfile1)

{
  int iVar1;
  char *__src;
  
  builtin_strncpy(urltype,"https://",9);
  if (*outfile1 != '\0') {
    iVar1 = strncmp(outfile1,"file://",7);
    __src = outfile1 + 7;
    if (iVar1 != 0) {
      __src = outfile1;
    }
    strcpy(netoutfile,__src);
    iVar1 = strncmp(outfile1,"mem:",4);
    if (iVar1 == 0) {
      builtin_strncpy(urltype,"httpsmem://",0xc);
    }
    else {
      builtin_strncpy(urltype,"httpsfile://",0xd);
    }
  }
  return 0;
}

Assistant:

int https_checkfile (char *urltype, char *infile, char *outfile1)
{
  /* set default  */
  strcpy(urltype,"https://");
  
  if (strlen(outfile1))
  {
    /* don't copy the "file://" prefix, if present.  */
    if (!strncmp(outfile1, "file://", 7) ) {
      strcpy(netoutfile,outfile1+7);
    } else {
      strcpy(netoutfile,outfile1);
    }
    
    if (!strncmp(outfile1, "mem:", 4))
       strcpy(urltype,"httpsmem://");
    else       
       strcpy(urltype,"httpsfile://");
  }

   return 0;
}